

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Entity_Damage_Status_PDU.cpp
# Opt level: O2

KString * __thiscall
KDIS::PDU::Entity_Damage_Status_PDU::GetAsString_abi_cxx11_
          (KString *__return_storage_ptr__,Entity_Damage_Status_PDU *this)

{
  pointer pKVar1;
  ostream *poVar2;
  ulong uVar3;
  pointer pKVar4;
  char cVar5;
  KString local_3a0;
  string local_380 [32];
  KString local_360;
  stringstream local_340 [16];
  ostream local_330 [376];
  KStringStream ss;
  ostream local_1a8 [376];
  
  std::__cxx11::stringstream::stringstream((stringstream *)&ss);
  Header7::GetAsString_abi_cxx11_(&local_360,&this->super_Header);
  poVar2 = std::operator<<(local_1a8,(string *)&local_360);
  poVar2 = std::operator<<(poVar2,"-Entity Damage Status PDU-\n");
  poVar2 = std::operator<<(poVar2,"Damaged Entity ID:\n");
  DATA_TYPE::EntityIdentifier::GetAsString_abi_cxx11_(&local_3a0,&this->m_DmgEnt);
  std::__cxx11::stringstream::stringstream(local_340);
  std::operator<<(local_330,'\t');
  uVar3 = 0;
  while( true ) {
    uVar3 = uVar3 & 0xffff;
    if (local_3a0._M_string_length <= uVar3) break;
    cVar5 = local_3a0._M_dataplus._M_p[uVar3];
    if (local_3a0._M_string_length - 1 != uVar3 && cVar5 == '\n') {
      cVar5 = '\t';
      std::operator<<(local_330,'\n');
    }
    std::operator<<(local_330,cVar5);
    uVar3 = (ulong)((int)uVar3 + 1);
  }
  std::__cxx11::stringbuf::str();
  std::__cxx11::stringstream::~stringstream(local_340);
  poVar2 = std::operator<<(poVar2,local_380);
  poVar2 = std::operator<<(poVar2,"Number Of DD Records: ");
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,this->m_ui16NumDmgDescRecs);
  std::operator<<(poVar2,"\nDE Records:\n");
  std::__cxx11::string::~string(local_380);
  std::__cxx11::string::~string((string *)&local_3a0);
  std::__cxx11::string::~string((string *)&local_360);
  pKVar1 = (this->m_vDdRec).
           super__Vector_base<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::StandardVariable>,_std::allocator<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::StandardVariable>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  for (pKVar4 = (this->m_vDdRec).
                super__Vector_base<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::StandardVariable>,_std::allocator<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::StandardVariable>_>_>
                ._M_impl.super__Vector_impl_data._M_start; pKVar4 != pKVar1; pKVar4 = pKVar4 + 1) {
    (*(pKVar4->m_pRef->super_DataTypeBase)._vptr_DataTypeBase[2])((string *)local_340);
    std::operator<<(local_1a8,(string *)local_340);
    std::__cxx11::string::~string((string *)local_340);
  }
  std::__cxx11::stringbuf::str();
  std::__cxx11::stringstream::~stringstream((stringstream *)&ss);
  return __return_storage_ptr__;
}

Assistant:

KString Entity_Damage_Status_PDU::GetAsString() const
{
    KStringStream ss;

    ss << Header::GetAsString()
       << "-Entity Damage Status PDU-\n"
       << "Damaged Entity ID:\n"
       << IndentString( m_DmgEnt.GetAsString(), 1 )
       << "Number Of DD Records: " << m_ui16NumDmgDescRecs
       << "\nDE Records:\n";

    vector<StdVarPtr>::const_iterator citr = m_vDdRec.begin();
    vector<StdVarPtr>::const_iterator citrEnd = m_vDdRec.end();
    for( ; citr != citrEnd; ++citr )
    {
        ss << ( *citr )->GetAsString();
    }

    return ss.str();
}